

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void client_timeout_handler(cio_timer *timer,void *handler_context,cio_error err)

{
  cio_error cVar1;
  cio_http_client *client;
  cio_error err_local;
  void *handler_context_local;
  cio_timer *timer_local;
  
  if ((err == CIO_SUCCESS) &&
     (cVar1 = write_response((cio_http_client *)handler_context,CIO_HTTP_STATUS_TIMEOUT,
                             (cio_write_buffer *)0x0,(cio_response_written_cb_t)0x0),
     cVar1 != CIO_SUCCESS)) {
    mark_to_be_closed((cio_http_client *)handler_context);
  }
  return;
}

Assistant:

static void client_timeout_handler(struct cio_timer *timer, void *handler_context, enum cio_error err)
{
	(void)timer;

	if (err == CIO_SUCCESS) {
		struct cio_http_client *client = handler_context;
		err = write_response(client, CIO_HTTP_STATUS_TIMEOUT, NULL, NULL);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			mark_to_be_closed(client);
		}
	}
}